

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

bool __thiscall slang::driver::Driver::parseAllSources(Driver *this)

{
  bool bVar1;
  iterator pDVar2;
  iterator pDVar3;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *in_RDI;
  Diagnostic *diag;
  iterator __end2;
  iterator __begin2;
  Diagnostics *__range2;
  Diagnostics pragmaDiags;
  Bag optionBag;
  Bag *in_stack_00000580;
  SourceLoader *in_stack_00000588;
  Bag *in_stack_00000608;
  Driver *in_stack_00000610;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  *this_00;
  Driver *in_stack_fffffffffffffe88;
  DiagnosticEngine *in_stack_fffffffffffffe98;
  Diagnostic *in_stack_ffffffffffffff18;
  DiagnosticEngine *in_stack_ffffffffffffff20;
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  local_40 [2];
  byte local_1;
  
  this_00 = local_40;
  Bag::Bag((Bag *)0xb61a5e);
  addParseOptions(in_stack_00000610,in_stack_00000608);
  SourceLoader::loadAndParseSources(in_stack_00000588,in_stack_00000580);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::operator=(this_00,in_RDI);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::~vector(this_00);
  bVar1 = reportLoadErrors(in_stack_fffffffffffffe88);
  if (bVar1) {
    DiagnosticEngine::setMappingsFromPragmas(in_stack_fffffffffffffe98);
    pDVar2 = SmallVectorBase<slang::Diagnostic>::begin
                       ((SmallVectorBase<slang::Diagnostic> *)&stack0xfffffffffffffe98);
    pDVar3 = SmallVectorBase<slang::Diagnostic>::end
                       ((SmallVectorBase<slang::Diagnostic> *)&stack0xfffffffffffffe98);
    for (; pDVar2 != pDVar3; pDVar2 = pDVar2 + 1) {
      DiagnosticEngine::issue(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    }
    local_1 = 1;
    Diagnostics::~Diagnostics((Diagnostics *)0xb61bc0);
  }
  else {
    local_1 = 0;
  }
  Bag::~Bag((Bag *)0xb61bcd);
  return (bool)(local_1 & 1);
}

Assistant:

bool Driver::parseAllSources() {
    Bag optionBag;
    addParseOptions(optionBag);

    syntaxTrees = sourceLoader.loadAndParseSources(optionBag);
    if (!reportLoadErrors())
        return false;

    Diagnostics pragmaDiags = diagEngine.setMappingsFromPragmas();
    for (auto& diag : pragmaDiags)
        diagEngine.issue(diag);

    return true;
}